

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chacha.c
# Opt level: O1

int chacha_test_multiblock_incremental(chacha_key *key,chacha_iv *iv,uint8_t *in,uint8_t *out)

{
  uint *puVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  size_t sVar7;
  uint8_t *puVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  long lVar12;
  ulong uVar13;
  long lVar14;
  uint8_t *in_00;
  ulong uVar15;
  bool bVar16;
  uint8_t final [64];
  chacha_state st;
  uint local_f8 [16];
  chacha_state local_b8;
  
  iVar5 = 1;
  lVar12 = -1;
  uVar9 = 1;
  do {
    memset(out,0,0x800);
    local_b8.opaque._0_8_ = *(undefined8 *)key->b;
    local_b8.opaque._8_8_ = *(undefined8 *)(key->b + 8);
    local_b8.opaque._16_8_ = *(undefined8 *)(key->b + 0x10);
    local_b8.opaque._24_8_ = *(undefined8 *)(key->b + 0x18);
    local_b8.opaque._40_8_ = *(undefined8 *)iv->b;
    local_b8.opaque[0x30] = '\b';
    local_b8.opaque[0x31] = '\0';
    local_b8.opaque[0x32] = '\0';
    local_b8.opaque[0x33] = '\0';
    local_b8.opaque[0x34] = '\0';
    local_b8.opaque[0x35] = '\0';
    local_b8.opaque[0x36] = '\0';
    local_b8.opaque[0x37] = '\0';
    local_b8.opaque[0x38] = '\0';
    local_b8.opaque[0x39] = '\0';
    local_b8.opaque[0x3a] = '\0';
    local_b8.opaque[0x3b] = '\0';
    local_b8.opaque[0x3c] = '\0';
    local_b8.opaque[0x3d] = '\0';
    local_b8.opaque[0x3e] = '\0';
    local_b8.opaque[0x3f] = '\0';
    local_b8.opaque[0x20] = 0xff;
    local_b8.opaque[0x21] = 0xff;
    local_b8.opaque[0x22] = 0xff;
    local_b8.opaque[0x23] = 0xff;
    local_b8.opaque[0x24] = '\0';
    local_b8.opaque[0x25] = '\0';
    local_b8.opaque[0x26] = '\0';
    local_b8.opaque[0x27] = '\0';
    lVar14 = 0;
    uVar15 = 0;
    puVar8 = out;
    uVar13 = uVar9;
    do {
      uVar10 = 0x800;
      if (uVar13 < 0x800) {
        uVar10 = uVar13;
      }
      in_00 = in + uVar15;
      if (in == (uint8_t *)0x0) {
        in_00 = (uint8_t *)0x0;
      }
      uVar15 = uVar15 + uVar9;
      sVar7 = chacha_update(&local_b8,in_00,puVar8,uVar10 + lVar14);
      puVar8 = puVar8 + sVar7;
      uVar13 = uVar13 + uVar9;
      lVar14 = lVar14 + lVar12;
    } while (uVar15 < 0x801);
    chacha_final(&local_b8,puVar8);
    local_f8[0] = 0;
    local_f8[1] = 0;
    local_f8[2] = 0;
    local_f8[3] = 0;
    local_f8[4] = 0;
    local_f8[5] = 0;
    local_f8[6] = 0;
    local_f8[7] = 0;
    local_f8[8] = 0;
    local_f8[9] = 0;
    local_f8[10] = 0;
    local_f8[0xb] = 0;
    local_f8[0xc] = 0;
    local_f8[0xd] = 0;
    local_f8[0xe] = 0;
    local_f8[0xf] = 0;
    lVar14 = 0;
    puVar8 = out;
    do {
      lVar11 = 0;
      do {
        puVar1 = (uint *)(puVar8 + lVar11);
        uVar2 = puVar1[1];
        uVar3 = puVar1[2];
        uVar4 = puVar1[3];
        *(uint *)((long)local_f8 + lVar11) = *puVar1 ^ *(uint *)((long)local_f8 + lVar11);
        *(uint *)((long)local_f8 + lVar11 + 4) = uVar2 ^ *(uint *)((long)local_f8 + lVar11 + 4);
        *(uint *)((long)local_f8 + lVar11 + 8) = uVar3 ^ *(uint *)((long)local_f8 + lVar11 + 8);
        *(uint *)((long)local_f8 + lVar11 + 0xc) = uVar4 ^ *(uint *)((long)local_f8 + lVar11 + 0xc);
        lVar11 = lVar11 + 0x10;
      } while (lVar11 != 0x40);
      lVar14 = lVar14 + 1;
      puVar8 = puVar8 + 0x40;
    } while (lVar14 != 0x20);
    iVar6 = bcmp(expected_chacha,local_f8,0x40);
    if (iVar6 != 0) {
      iVar5 = 0;
    }
    lVar12 = lVar12 + -0x3d;
    bVar16 = uVar9 < 0x7c3;
    uVar9 = uVar9 + 0x3d;
  } while (bVar16);
  return iVar5;
}

Assistant:

static int
chacha_test_multiblock_incremental(chacha_key *key, chacha_iv *iv, const uint8_t *in, uint8_t *out) {
    chacha_state st;
    uint8_t final[CHACHA_BLOCKBYTES];
    size_t i, inc;
    uint8_t *p;
    int res = 1;

    for (inc = 1; inc < CHACHA_TEST_LEN; inc += 61) {
        p = out;
        memset(out, 0, CHACHA_TEST_LEN);
        chacha_test_init_state(&st, key, iv);
        for(i = 0; i <= CHACHA_TEST_LEN; i += inc)
            p += chacha_update(&st, (in) ? (in + i) : NULL, p, ((i + inc) > CHACHA_TEST_LEN) ? (CHACHA_TEST_LEN - i) : inc);
        chacha_final(&st, p);
        chacha_test_compact_array(final, out, CHACHA_TEST_LEN);
        res &= (memcmp(expected_chacha, final, sizeof(expected_chacha)) == 0) ? 1 : 0;
    }

    return res;
}